

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOptimizationTests.cpp
# Opt level: O0

ProgramData * __thiscall
deqp::gles3::Performance::anon_unknown_1::ConstantPropagationCase::generateProgramData
          (ProgramData *__return_storage_ptr__,ConstantPropagationCase *this,bool optimized)

{
  undefined7 in_register_00000011;
  bool useHeavierWorkload;
  bool bVar1;
  allocator<char> local_6d [13];
  undefined1 local_60 [8];
  string statements;
  string precision;
  bool isVertexCase;
  bool optimized_local;
  ConstantPropagationCase *this_local;
  
  useHeavierWorkload =
       (this->super_ShaderOptimizationCase).m_caseShaderType == CASESHADERTYPE_VERTEX;
  Performance::(anonymous_namespace)::getShaderPrecision_abi_cxx11_
            ((string *)((long)&statements.field_2 + 8),
             (_anonymous_namespace_ *)(ulong)(this->super_ShaderOptimizationCase).m_caseShaderType,
             (CaseShaderType)CONCAT71(in_register_00000011,optimized));
  bVar1 = false;
  if (this->m_caseType == CASETYPE_BUILT_IN_FUNCTIONS) {
    builtinFunctionsCaseStatements
              ((string *)local_60,optimized,(bool)(this->m_useConstantExpressionsOnly & 1),
               (string *)((long)&statements.field_2 + 8),useHeavierWorkload);
  }
  else if (this->m_caseType == CASETYPE_ARRAY) {
    arrayCaseStatements((string *)local_60,optimized,(bool)(this->m_useConstantExpressionsOnly & 1),
                        (string *)((long)&statements.field_2 + 8),useHeavierWorkload);
  }
  else {
    bVar1 = this->m_caseType != CASETYPE_STRUCT;
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_60,(char *)0x0,local_6d);
    }
    else {
      structCaseStatements
                ((string *)local_60,optimized,(bool)(this->m_useConstantExpressionsOnly & 1),
                 (string *)((long)&statements.field_2 + 8),useHeavierWorkload);
    }
  }
  if (bVar1) {
    std::allocator<char>::~allocator(local_6d);
  }
  defaultProgramData(__return_storage_ptr__,(this->super_ShaderOptimizationCase).m_caseShaderType,
                     (string *)local_60);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(statements.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

ProgramData generateProgramData (bool optimized) const
	{
		const bool		isVertexCase	= m_caseShaderType == CASESHADERTYPE_VERTEX;
		const string	precision		= getShaderPrecision(m_caseShaderType);
		const string	statements		= m_caseType == CASETYPE_BUILT_IN_FUNCTIONS		? builtinFunctionsCaseStatements	(optimized, m_useConstantExpressionsOnly, precision, isVertexCase)
										: m_caseType == CASETYPE_ARRAY					? arrayCaseStatements				(optimized, m_useConstantExpressionsOnly, precision, isVertexCase)
										: m_caseType == CASETYPE_STRUCT					? structCaseStatements				(optimized, m_useConstantExpressionsOnly, precision, isVertexCase)
										: DE_NULL;

		return defaultProgramData(m_caseShaderType, statements);
	}